

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

Storage * __thiscall llvm::APFloat::Storage::operator=(Storage *this,Storage *RHS)

{
  bool bVar1;
  Storage *RHS_local;
  Storage *this_local;
  
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(*(fltSemantics **)this);
  if ((bVar1) && (bVar1 = usesLayout<llvm::detail::IEEEFloat>(RHS->semantics), bVar1)) {
    detail::IEEEFloat::operator=((IEEEFloat *)this,&RHS->IEEE);
  }
  else {
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(*(fltSemantics **)this);
    if ((bVar1) && (bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(RHS->semantics), bVar1)) {
      detail::DoubleAPFloat::operator=((DoubleAPFloat *)this,(DoubleAPFloat *)&RHS->IEEE);
    }
    else if ((Storage *)this != RHS) {
      ~Storage(this);
      Storage(this,RHS);
    }
  }
  return (Storage *)this;
}

Assistant:

Storage &operator=(const Storage &RHS) {
      if (usesLayout<IEEEFloat>(*semantics) &&
          usesLayout<IEEEFloat>(*RHS.semantics)) {
        IEEE = RHS.IEEE;
      } else if (usesLayout<DoubleAPFloat>(*semantics) &&
                 usesLayout<DoubleAPFloat>(*RHS.semantics)) {
        Double = RHS.Double;
      } else if (this != &RHS) {
        this->~Storage();
        new (this) Storage(RHS);
      }
      return *this;
    }